

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O2

void __thiscall
toml::source_location::source_location(source_location *this,source_location *param_1)

{
  uint_least32_t uVar1;
  
  this->region_size_ = param_1->region_size_;
  uVar1 = param_1->column_num_;
  this->line_num_ = param_1->line_num_;
  this->column_num_ = uVar1;
  std::__cxx11::string::string((string *)&this->file_name_,(string *)&param_1->file_name_);
  std::__cxx11::string::string((string *)&this->line_str_,(string *)&param_1->line_str_);
  return;
}

Assistant:

source_location(source_location const&) = default;